

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

uint256 * ParseHashV(uint256 *__return_storage_ptr__,UniValue *v,string_view name)

{
  bool bVar1;
  string *args;
  UniValue *pUVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  size_type local_60;
  undefined1 local_54 [4];
  string_view name_local;
  string local_40;
  long local_20;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  args = UniValue::get_str_abi_cxx11_(v);
  if (args->_M_string_length == 0x40) {
    str_00._M_str = (args->_M_dataplus)._M_p;
    str_00._M_len = 0x40;
    bVar1 = IsHex(str_00);
    if (bVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        str._M_str = (args->_M_dataplus)._M_p;
        str._M_len = args->_M_string_length;
        uint256S(__return_storage_ptr__,str);
        return __return_storage_ptr__;
      }
    }
    else {
      pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
      tinyformat::format<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                (&local_40,(tinyformat *)"%s must be hexadecimal string (not \'%s\')",
                 (char *)&name_local,(basic_string_view<char,_std::char_traits<char>_> *)args,in_R8)
      ;
      JSONRPCError(pUVar2,-8,&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  else {
    pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
    local_54 = (undefined1  [4])0x40;
    local_60 = args->_M_string_length;
    tinyformat::
    format<std::basic_string_view<char,std::char_traits<char>>,int,unsigned_long,std::__cxx11::string>
              (&local_40,(tinyformat *)"%s must be of length %d (not %d, for \'%s\')",
               (char *)&name_local,(basic_string_view<char,_std::char_traits<char>_> *)local_54,
               (int *)&local_60,(unsigned_long *)args,in_stack_ffffffffffffff98);
    JSONRPCError(pUVar2,-8,&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

uint256 ParseHashV(const UniValue& v, std::string_view name)
{
    const std::string& strHex(v.get_str());
    if (64 != strHex.length())
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("%s must be of length %d (not %d, for '%s')", name, 64, strHex.length(), strHex));
    if (!IsHex(strHex)) // Note: IsHex("") is false
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("%s must be hexadecimal string (not '%s')", name, strHex));
    return uint256S(strHex);
}